

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.cc
# Opt level: O0

ssize_t __thiscall bsplib::A2A::send(A2A *this,int __fd,void *__buf,size_t __n,int __flags)

{
  value_type vVar1;
  ulong uVar2;
  size_t sVar3;
  size_type sVar4;
  reference pvVar5;
  unsigned_long *puVar6;
  long lVar7;
  reference pvVar8;
  char *pcVar9;
  void *send_buf;
  size_t i;
  size_t displ;
  unsigned_long uStack_48;
  int p;
  unsigned_long local_40;
  unsigned_long local_38;
  size_t new_cap;
  size_t offset;
  size_t size_local;
  void *data_local;
  A2A *pAStack_10;
  int dst_pid_local;
  A2A *this_local;
  
  offset = __n;
  size_local = (size_t)__buf;
  data_local._4_4_ = __fd;
  pAStack_10 = this;
  if (__fd < 0) {
    __assert_fail("dst_pid >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                  ,0x47,"void *bsplib::A2A::send(int, const void *, std::size_t)");
  }
  if (__fd < this->m_nprocs) {
    uVar2 = this->m_send_cap;
    sVar4 = std::vector<char,_std::allocator<char>_>::size(&this->m_send_bufs);
    if (uVar2 == sVar4 / (ulong)(long)this->m_nprocs) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_send_sizes,(long)data_local._4_4_);
      new_cap = *pvVar5;
      if (this->m_send_cap < new_cap + offset) {
        local_40 = this->m_send_cap << 1;
        uStack_48 = new_cap + offset;
        puVar6 = std::max<unsigned_long>(&local_40,&stack0xffffffffffffffb8);
        local_38 = *puVar6;
        std::vector<char,_std::allocator<char>_>::resize
                  (&this->m_send_bufs,(long)this->m_nprocs * local_38);
        for (displ._4_4_ = this->m_nprocs; 0 < displ._4_4_; displ._4_4_ = displ._4_4_ + -1) {
          lVar7 = local_38 - this->m_send_cap;
          for (send_buf = (void *)((long)displ._4_4_ * local_38);
              (void *)((long)(displ._4_4_ + -1) * local_38) < send_buf;
              send_buf = (void *)((long)send_buf + -1)) {
            pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                               (&this->m_send_bufs,
                                (long)send_buf + (-1 - lVar7 * (displ._4_4_ + -1)));
            vVar1 = *pvVar8;
            pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                               (&this->m_send_bufs,(long)send_buf - 1);
            *pvVar8 = vVar1;
          }
        }
        this->m_send_cap = local_38;
      }
      sVar3 = offset;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_send_sizes,(long)data_local._4_4_);
      *pvVar5 = sVar3 + *pvVar5;
      pcVar9 = std::vector<char,_std::allocator<char>_>::data(&this->m_send_bufs);
      lVar7 = new_cap + (long)data_local._4_4_ * this->m_send_cap;
      memcpy(pcVar9 + lVar7,(void *)size_local,offset);
      return (ssize_t)(pcVar9 + lVar7);
    }
    __assert_fail("m_send_cap == m_send_bufs.size() / m_nprocs",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                  ,0x4a,"void *bsplib::A2A::send(int, const void *, std::size_t)");
  }
  __assert_fail("dst_pid < m_nprocs",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                ,0x48,"void *bsplib::A2A::send(int, const void *, std::size_t)");
}

Assistant:

void * A2A::send( int dst_pid, const void * data, std::size_t size )
{
    assert( dst_pid >= 0 );
    assert( dst_pid < m_nprocs );

    assert( m_send_cap == m_send_bufs.size() / m_nprocs );

    std::size_t offset = m_send_sizes[ dst_pid ];
    if ( m_send_cap < offset + size ) {
        std::size_t new_cap =
           std::max( 2 * m_send_cap , offset + size );

        m_send_bufs.resize( m_nprocs * new_cap );
        for ( int p = m_nprocs; p > 0; --p ) {
            std::size_t displ = new_cap - m_send_cap;

            for ( size_t i = p*new_cap; i > (p-1)*new_cap; --i) {
                m_send_bufs[i-1] = m_send_bufs[i-displ*(p-1)-1];
            }
        }  
        m_send_cap = new_cap;
    }
    m_send_sizes[ dst_pid ] += size;
    void * send_buf = m_send_bufs.data() + dst_pid * m_send_cap + offset;
    std::memcpy( send_buf , data, size );
    return send_buf;
}